

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O0

void rw::xbox::instance(ObjPipeline *rwpipe,Atomic *atomic)

{
  Geometry *pGVar1;
  MeshHeader *this;
  InstanceDataHeader *pIVar2;
  void *pvVar3;
  uint32 uVar4;
  uint local_5c;
  long lStack_58;
  uint32 i_1;
  uint8 *indexbuf;
  InstanceData *inst;
  Mesh *pMStack_40;
  uint32 i;
  Mesh *mesh;
  MeshHeader *meshh;
  InstanceDataHeader *header;
  Geometry *geo;
  ObjPipeline *pipe;
  Atomic *atomic_local;
  ObjPipeline *rwpipe_local;
  
  pGVar1 = atomic->geometry;
  if (pGVar1->instData == (InstanceDataHeader *)0x0) {
    pIVar2 = (InstanceDataHeader *)
             mustmalloc_LOC(0x40,0x3000f,
                            "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/xbox.cpp line: 205"
                           );
    this = pGVar1->meshHeader;
    pGVar1->instData = pIVar2;
    pIVar2->platform = 5;
    pIVar2[1].platform = (uint)this->numMeshes * 0x18 + 0x34;
    pMStack_40 = MeshHeader::getMeshes(this);
    for (inst._4_4_ = 0; inst._4_4_ < this->numMeshes; inst._4_4_ = inst._4_4_ + 1) {
      pIVar2[1].platform = (pMStack_40->numIndices * 2 + 0xf & 0xfffffff0) + pIVar2[1].platform;
      pMStack_40 = pMStack_40 + 1;
    }
    pvVar3 = mustmalloc_LOC((long)(int)(pIVar2[1].platform + 0x18),0x3000f,
                            "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/xbox.cpp line: 216"
                           );
    *(void **)(pIVar2 + 0xe) = pvVar3;
    *(uint16 *)&pIVar2[2].platform = this->serialNum;
    *(uint16 *)((long)&pIVar2[2].platform + 2) = this->numMeshes;
    uVar4 = 5;
    if (this->flags == 1) {
      uVar4 = 6;
    }
    pIVar2[3].platform = uVar4;
    pIVar2[4].platform = pGVar1->numVertices;
    pIVar2[8].platform = 0;
    pIVar2[5].platform = 0;
    *(undefined8 *)(pIVar2 + 6) = 0;
    indexbuf = (uint8 *)mustmalloc_LOC((ulong)*(ushort *)((long)&pIVar2[2].platform + 2) * 0x28,
                                       0x3000f,
                                       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/xbox.cpp line: 227"
                                      );
    *(uint8 **)(pIVar2 + 10) = indexbuf;
    pMStack_40 = MeshHeader::getMeshes(this);
    lStack_58 = *(long *)(pIVar2 + 0xe) +
                (long)(int)((uint)*(ushort *)((long)&pIVar2[2].platform + 2) * 0x18 + 0x4b &
                           0xfffffff0);
    for (local_5c = 0; local_5c < *(ushort *)((long)&pIVar2[2].platform + 2);
        local_5c = local_5c + 1) {
      findMinVertAndNumVertices
                (pMStack_40->indices,pMStack_40->numIndices,(uint32 *)indexbuf,
                 (int32 *)(indexbuf + 4));
      *(uint32 *)(indexbuf + 8) = pMStack_40->numIndices;
      *(long *)(indexbuf + 0x10) = lStack_58;
      memcpy(*(void **)(indexbuf + 0x10),pMStack_40->indices,(long)*(int *)(indexbuf + 8) << 1);
      lStack_58 = lStack_58 + (int)(*(int *)(indexbuf + 8) * 2 + 0xfU & 0xfffffff0);
      *(Material **)(indexbuf + 0x18) = pMStack_40->material;
      indexbuf[0x20] = '\0';
      indexbuf[0x21] = '\0';
      indexbuf[0x22] = '\0';
      indexbuf[0x23] = '\0';
      pMStack_40 = pMStack_40 + 1;
      indexbuf = indexbuf + 0x28;
    }
    *(uint8 **)(pIVar2 + 0xc) = indexbuf;
    (**(code **)&rwpipe[1].super_Pipeline)(pGVar1,pIVar2);
  }
  return;
}

Assistant:

static void
instance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	// TODO: allow for REINSTANCE (or not, xbox can't render)
	if(geo->instData)
		return;
	InstanceDataHeader *header = rwNewT(InstanceDataHeader, 1, MEMDUR_EVENT | ID_GEOMETRY);
	MeshHeader *meshh = geo->meshHeader;
	geo->instData = header;
	header->platform = PLATFORM_XBOX;

	header->size = 0x24 + meshh->numMeshes*0x18 + 0x10;
	Mesh *mesh = meshh->getMeshes();
	for(uint32 i = 0; i < meshh->numMeshes; i++)
		header->size += (mesh++->numIndices*2 + 0xF) & ~0xF;
	// The 0x18 byte are the resentryheader.
	// We don't have it but it's used for alignment.
	header->data = rwNewT(uint8, header->size + 0x18, MEMDUR_EVENT | ID_GEOMETRY);
	header->serialNumber = meshh->serialNum;
	header->numMeshes = meshh->numMeshes;
	header->primType = meshh->flags == MeshHeader::TRISTRIP ?
		D3DPT_TRIANGLESTRIP : D3DPT_TRIANGLELIST;
	header->numVertices = geo->numVertices;
	header->vertexAlpha = 0;
	// set by the instanceCB
	header->stride = 0;
	header->vertexBuffer = nil;

	InstanceData *inst = rwNewT(InstanceData, header->numMeshes, MEMDUR_EVENT | ID_GEOMETRY);
	header->begin = inst;
	mesh = meshh->getMeshes();
	uint8 *indexbuf = (uint8*)header->data + ((0x18 + 0x24 + header->numMeshes*0x18 + 0xF)&~0xF);
	for(uint32 i = 0; i < header->numMeshes; i++){
		findMinVertAndNumVertices(mesh->indices, mesh->numIndices,
		                          &inst->minVert, &inst->numVertices);
		inst->numIndices = mesh->numIndices;
		inst->indexBuffer = indexbuf;
		memcpy(inst->indexBuffer, mesh->indices, inst->numIndices*sizeof(uint16));
		indexbuf += (inst->numIndices*2 + 0xF) & ~0xF;
		inst->material = mesh->material;
		inst->vertexShader = 0;	// TODO?
		mesh++;
		inst++;
	}
	header->end = inst;

	pipe->instanceCB(geo, header);
}